

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_704UL,_16UL>_>
::unchecked_rehash(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_704UL,_16UL>_>
                   *this,arrays_type *new_arrays_)

{
  group_type_pointer pgVar1;
  size_t sVar2;
  group_type_pointer pgVar3;
  group_type_pointer pgVar4;
  uint uVar5;
  ushort uVar6;
  char *pcVar7;
  uint64_t uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  group_type_pointer pgVar13;
  ulong uVar14;
  PortInfo *pPVar15;
  value_type_pointer ppVar16;
  PortInfo *pPVar17;
  value_type_pointer sv;
  value_type_pointer ppVar18;
  bool bVar19;
  byte bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  bVar20 = 0;
  ppVar18 = (this->arrays).elements_;
  if (ppVar18 != (value_type_pointer)0x0) {
    sVar2 = (this->arrays).groups_size_mask;
    pgVar3 = (this->arrays).groups_;
    if (pgVar3 != pgVar3 + sVar2 + 1) {
      pgVar13 = pgVar3;
      do {
        auVar21[0] = -(pgVar13->m[0].n == '\0');
        auVar21[1] = -(pgVar13->m[1].n == '\0');
        auVar21[2] = -(pgVar13->m[2].n == '\0');
        auVar21[3] = -(pgVar13->m[3].n == '\0');
        auVar21[4] = -(pgVar13->m[4].n == '\0');
        auVar21[5] = -(pgVar13->m[5].n == '\0');
        auVar21[6] = -(pgVar13->m[6].n == '\0');
        auVar21[7] = -(pgVar13->m[7].n == '\0');
        auVar21[8] = -(pgVar13->m[8].n == '\0');
        auVar21[9] = -(pgVar13->m[9].n == '\0');
        auVar21[10] = -(pgVar13->m[10].n == '\0');
        auVar21[0xb] = -(pgVar13->m[0xb].n == '\0');
        auVar21[0xc] = -(pgVar13->m[0xc].n == '\0');
        auVar21[0xd] = -(pgVar13->m[0xd].n == '\0');
        auVar21[0xe] = -(pgVar13->m[0xe].n == '\0');
        auVar21[0xf] = -(pgVar13->m[0xf].n == '\0');
        for (uVar12 = ((uint)(pgVar3 + sVar2 != pgVar13) << 0xe | 0x3fff) &
                      ~(uint)(ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                                     (ushort)(auVar21[0xf] >> 7) << 0xf); uVar12 != 0;
            uVar12 = uVar12 - 1 & uVar12) {
          uVar9 = 0;
          if (uVar12 != 0) {
            for (; (uVar12 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
            }
          }
          sv = ppVar18 + uVar9;
          uVar8 = slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                  operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                             this,&sv->first);
          uVar14 = uVar8 >> ((byte)new_arrays_->groups_size_index & 0x3f);
          pgVar4 = new_arrays_->groups_;
          pgVar1 = pgVar4 + uVar14;
          auVar23[0] = -(pgVar1->m[0].n == '\0');
          auVar23[1] = -(pgVar1->m[1].n == '\0');
          auVar23[2] = -(pgVar1->m[2].n == '\0');
          auVar23[3] = -(pgVar1->m[3].n == '\0');
          auVar23[4] = -(pgVar1->m[4].n == '\0');
          auVar23[5] = -(pgVar1->m[5].n == '\0');
          auVar23[6] = -(pgVar1->m[6].n == '\0');
          auVar23[7] = -(pgVar1->m[7].n == '\0');
          auVar23[8] = -(pgVar1->m[8].n == '\0');
          auVar23[9] = -(pgVar1->m[9].n == '\0');
          auVar23[10] = -(pgVar1->m[10].n == '\0');
          auVar23[0xb] = -(pgVar1->m[0xb].n == '\0');
          auVar23[0xc] = -(pgVar1->m[0xc].n == '\0');
          auVar23[0xd] = -(pgVar1->m[0xd].n == '\0');
          auVar23[0xe] = -(pgVar1->m[0xe].n == '\0');
          auVar23[0xf] = -(pgVar1->m[0xf].n == '\0');
          uVar9 = (uint)(ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe);
          if (uVar9 == 0) {
            uVar11 = new_arrays_->groups_size_mask;
            lVar10 = 1;
            do {
              pgVar4[uVar14].m[0xf].n = pgVar4[uVar14].m[0xf].n | '\x01' << ((byte)uVar8 & 7);
              uVar14 = uVar14 + lVar10 & uVar11;
              pgVar1 = pgVar4 + uVar14;
              auVar22[0] = -(pgVar1->m[0].n == '\0');
              auVar22[1] = -(pgVar1->m[1].n == '\0');
              auVar22[2] = -(pgVar1->m[2].n == '\0');
              auVar22[3] = -(pgVar1->m[3].n == '\0');
              auVar22[4] = -(pgVar1->m[4].n == '\0');
              auVar22[5] = -(pgVar1->m[5].n == '\0');
              auVar22[6] = -(pgVar1->m[6].n == '\0');
              auVar22[7] = -(pgVar1->m[7].n == '\0');
              auVar22[8] = -(pgVar1->m[8].n == '\0');
              auVar22[9] = -(pgVar1->m[9].n == '\0');
              auVar22[10] = -(pgVar1->m[10].n == '\0');
              auVar22[0xb] = -(pgVar1->m[0xb].n == '\0');
              auVar22[0xc] = -(pgVar1->m[0xc].n == '\0');
              auVar22[0xd] = -(pgVar1->m[0xd].n == '\0');
              auVar22[0xe] = -(pgVar1->m[0xe].n == '\0');
              auVar22[0xf] = -(pgVar1->m[0xf].n == '\0');
              uVar6 = (ushort)(SUB161(auVar22 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe;
              uVar9 = (uint)uVar6;
              lVar10 = lVar10 + 1;
            } while (uVar6 == 0);
          }
          uVar5 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
            }
          }
          pcVar7 = (sv->first)._M_str;
          ppVar16 = new_arrays_->elements_ + uVar14 * 0xf + (ulong)uVar5;
          (ppVar16->first)._M_len = (sv->first)._M_len;
          (ppVar16->first)._M_str = pcVar7;
          pPVar15 = &sv->second;
          pPVar17 = &ppVar16->second;
          for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pPVar17->syntax).ptr = (pPVar15->syntax).ptr;
            pPVar15 = (PortInfo *)((long)pPVar15 + (ulong)bVar20 * -0x10 + 8);
            pPVar17 = (PortInfo *)((long)pPVar17 + (ulong)bVar20 * -0x10 + 8);
          }
          pgVar4[uVar14].m[uVar5].n =
               *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::
                           match_word(unsigned_long)::word + (uVar8 & 0xff));
        }
        ppVar18 = ppVar18 + 0xf;
        bVar19 = pgVar3 + sVar2 != pgVar13;
        pgVar13 = pgVar13 + 1;
      } while (bVar19);
    }
  }
  delete_arrays((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_704UL,_16UL>_>
                 *)(this->
                   super_empty_value<slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_704UL,_16UL>,_2U,_false>
                   ).value_.storage,(arrays_type *)(this->arrays).groups_size_mask);
  sVar2 = new_arrays_->groups_size_mask;
  pgVar3 = new_arrays_->groups_;
  ppVar18 = new_arrays_->elements_;
  (this->arrays).groups_size_index = new_arrays_->groups_size_index;
  (this->arrays).groups_size_mask = sVar2;
  (this->arrays).groups_ = pgVar3;
  (this->arrays).elements_ = ppVar18;
  uVar14 = (this->arrays).groups_size_mask * 0xf + 0xe;
  if ((this->arrays).elements_ == (value_type_pointer)0x0) {
    uVar14 = 0;
  }
  uVar11 = (ulong)((float)uVar14 * 0.875);
  uVar11 = (long)((float)uVar14 * 0.875 - 9.223372e+18) & (long)uVar11 >> 0x3f | uVar11;
  if (uVar14 < 0x1e) {
    uVar11 = uVar14;
  }
  (this->size_ctrl).ml = uVar11;
  return;
}

Assistant:

BOOST_NOINLINE void unchecked_rehash(arrays_type& new_arrays_) {
        std::size_t num_destroyed = 0;
        BOOST_TRY {
            for_all_elements([&, this](element_type* p) {
                nosize_transfer_element(p, new_arrays_, num_destroyed);
            });
        }